

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::MidiFile(MidiFile *this)

{
  bool bVar1;
  reference ppMVar2;
  MidiEventList *this_00;
  MidiEventList **event;
  iterator __end1;
  iterator __begin1;
  vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_> *__range1;
  MidiFile *this_local;
  
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::vector(&this->m_events);
  this->m_ticksPerQuarterNote = 0x78;
  this->m_theTrackState = 0;
  this->m_theTimeState = 1;
  std::__cxx11::string::string((string *)&this->m_readFileName);
  this->m_timemapvalid = false;
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::vector(&this->m_timemap);
  this->m_rwstatus = true;
  this->m_linkedEventsQ = false;
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,1);
  __end1 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::begin
                     (&this->m_events);
  event = (MidiEventList **)
          std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::end
                    (&this->m_events);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<smf::MidiEventList_**,_std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>_>
                                *)&event);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<smf::MidiEventList_**,_std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>_>
              ::operator*(&__end1);
    this_00 = (MidiEventList *)operator_new(0x18);
    MidiEventList::MidiEventList(this_00);
    *ppMVar2 = this_00;
    __gnu_cxx::
    __normal_iterator<smf::MidiEventList_**,_std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

MidiFile::MidiFile(void) {
	m_events.resize(1);
	for (auto &event : m_events) {
		event = new MidiEventList;
	}
}